

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snappy.cc
# Opt level: O1

void __thiscall
snappy::SnappyDecompressor::
DecompressAllTags<snappy::SnappyScatteredWriter<snappy::SnappySinkAllocator>>
          (SnappyDecompressor *this,SnappyScatteredWriter<snappy::SnappySinkAllocator> *writer)

{
  uint *puVar1;
  byte bVar2;
  ushort uVar3;
  char *pcVar4;
  bool bVar5;
  char cVar6;
  int iVar7;
  ulong in_RAX;
  undefined4 extraout_var;
  char *pcVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  char *pcVar12;
  ulong uVar13;
  long lVar14;
  uint *ip;
  ulong uVar15;
  size_t n;
  ulong local_38;
  
  ip = (uint *)this->ip_;
  local_38 = in_RAX;
  if ((long)this->ip_limit_ - (long)ip < 5) {
    bVar5 = RefillTag(this);
    if (!bVar5) {
      return;
    }
    ip = (uint *)this->ip_;
  }
  do {
    puVar1 = (uint *)((long)ip + 1);
    bVar2 = (byte)*ip;
    if ((bVar2 & 3) == 0) {
      uVar15 = (ulong)(bVar2 >> 2) + 1;
      if (((bVar2 < 0x40) && (0x14 < (ulong)((long)this->ip_limit_ - (long)puVar1))) &&
         (pcVar4 = writer->op_ptr_, 0xf < *(int *)&writer->op_limit_ - (int)pcVar4)) {
        *(undefined8 *)pcVar4 = *(undefined8 *)((long)ip + 1);
        *(undefined8 *)(pcVar4 + 8) = *(undefined8 *)((long)ip + 9);
        writer->op_ptr_ = pcVar4 + uVar15;
        ip = (uint *)((long)puVar1 + uVar15);
        cVar6 = '\x03';
      }
      else {
        ip = puVar1;
        if (0xec < bVar2) {
          uVar15 = (ulong)((*(uint *)(char_table + uVar15 * 4 + 0x110) & *puVar1) + 1);
          ip = (uint *)((long)puVar1 + ((ulong)(bVar2 >> 2) - 0x3b));
        }
        uVar10 = (long)this->ip_limit_ - (long)ip;
        if (uVar10 < uVar15) {
          do {
            if ((ulong)((long)writer->op_limit_ - (long)writer->op_ptr_) < uVar10) {
              bVar5 = SnappyScatteredWriter<snappy::SnappySinkAllocator>::SlowAppend
                                (writer,(char *)ip,uVar10);
              if (bVar5) goto LAB_001534ae;
LAB_001535f8:
              cVar6 = '\x01';
              goto LAB_001535fd;
            }
            memcpy(writer->op_ptr_,ip,uVar10);
            writer->op_ptr_ = writer->op_ptr_ + uVar10;
LAB_001534ae:
            (*this->reader_->_vptr_Source[4])(this->reader_,(ulong)this->peeked_);
            iVar7 = (*this->reader_->_vptr_Source[3])(this->reader_,&local_38);
            ip = (uint *)CONCAT44(extraout_var,iVar7);
            this->peeked_ = (uint32)local_38;
            if (local_38 == 0) goto LAB_001535f8;
            uVar15 = uVar15 - uVar10;
            this->ip_limit_ = (char *)((long)ip + local_38);
            uVar10 = local_38;
          } while (local_38 < uVar15);
        }
        if ((ulong)((long)writer->op_limit_ - (long)writer->op_ptr_) < uVar15) {
          bVar5 = SnappyScatteredWriter<snappy::SnappySinkAllocator>::SlowAppend
                            (writer,(char *)ip,uVar15);
          cVar6 = '\x01';
          if (!bVar5) goto LAB_001535fd;
        }
        else {
          memcpy(writer->op_ptr_,ip,uVar15);
          writer->op_ptr_ = writer->op_ptr_ + uVar15;
        }
        ip = (uint *)((long)ip + uVar15);
        cVar6 = '\0';
        if ((long)this->ip_limit_ - (long)ip < 5) {
          this->ip_ = (char *)ip;
          bVar5 = RefillTag(this);
          if (bVar5) {
            ip = (uint *)this->ip_;
          }
          cVar6 = !bVar5;
        }
      }
LAB_001535fd:
      if (cVar6 == '\0') goto LAB_001535a4;
    }
    else {
      uVar3 = *(ushort *)(char_table + (ulong)bVar2 * 2);
      uVar15 = (ulong)(uVar3 & 0xff);
      ip = (uint *)((long)puVar1 + (ulong)(uVar3 >> 0xb));
      uVar9 = (uVar3 & 0x700) + (*(uint *)(wordmask + (ulong)(uVar3 >> 0xb) * 4) & *puVar1);
      uVar10 = (ulong)uVar9;
      pcVar4 = writer->op_ptr_;
      if ((uVar10 - 1 < (ulong)((long)pcVar4 - (long)writer->op_base_)) &&
         (uVar15 + 10 <= (ulong)((long)writer->op_limit_ - (long)pcVar4))) {
        pcVar8 = pcVar4 + -uVar10;
        pcVar12 = pcVar4;
        uVar13 = uVar15;
        if (uVar9 < 8) {
          do {
            *(undefined8 *)pcVar12 = *(undefined8 *)pcVar8;
            uVar13 = uVar13 - uVar10;
            pcVar12 = pcVar12 + uVar10;
            uVar10 = (long)pcVar12 - (long)pcVar8;
          } while ((long)uVar10 < 8);
        }
        if (0 < (long)uVar13) {
          lVar14 = uVar13 + 8;
          lVar11 = 0;
          do {
            *(undefined8 *)(pcVar12 + lVar11) = *(undefined8 *)(pcVar8 + lVar11);
            lVar14 = lVar14 + -8;
            lVar11 = lVar11 + 8;
          } while (8 < lVar14);
        }
        writer->op_ptr_ = pcVar4 + uVar15;
LAB_00153575:
        bVar5 = true;
        if ((long)this->ip_limit_ - (long)ip < 5) {
          this->ip_ = (char *)ip;
          bVar5 = RefillTag(this);
          if (bVar5) {
            ip = (uint *)this->ip_;
          }
        }
      }
      else {
        bVar5 = SnappyScatteredWriter<snappy::SnappySinkAllocator>::SlowAppendFromSelf
                          (writer,uVar10,uVar15);
        if (bVar5) goto LAB_00153575;
        bVar5 = false;
      }
      cVar6 = '\x01';
      if (bVar5 != false) {
LAB_001535a4:
        cVar6 = '\0';
      }
    }
    if ((cVar6 != '\0') && (cVar6 != '\x03')) {
      return;
    }
  } while( true );
}

Assistant:

void DecompressAllTags(Writer* writer) {
    const char* ip = ip_;

    // We could have put this refill fragment only at the beginning of the loop.
    // However, duplicating it at the end of each branch gives the compiler more
    // scope to optimize the <ip_limit_ - ip> expression based on the local
    // context, which overall increases speed.
    #define MAYBE_REFILL() \
        if (ip_limit_ - ip < kMaximumTagLength) { \
          ip_ = ip; \
          if (!RefillTag()) return; \
          ip = ip_; \
        }

    MAYBE_REFILL();
    for ( ;; ) {
      const unsigned char c = *(reinterpret_cast<const unsigned char*>(ip++));

      if ((c & 0x3) == LITERAL) {
        size_t literal_length = (c >> 2) + 1u;
        if (writer->TryFastAppend(ip, ip_limit_ - ip, literal_length)) {
          assert(literal_length < 61);
          ip += literal_length;
          // NOTE(user): There is no MAYBE_REFILL() here, as TryFastAppend()
          // will not return true unless there's already at least five spare
          // bytes in addition to the literal.
          continue;
        }
        if (PREDICT_FALSE(literal_length >= 61)) {
          // Long literal.
          const size_t literal_length_length = literal_length - 60;
          literal_length =
              (LittleEndian::Load32(ip) & wordmask[literal_length_length]) + 1;
          ip += literal_length_length;
        }

        size_t avail = ip_limit_ - ip;
        while (avail < literal_length) {
          if (!writer->Append(ip, avail)) return;
          literal_length -= avail;
          reader_->Skip(peeked_);
          size_t n;
          ip = reader_->Peek(&n);
          avail = n;
          peeked_ = avail;
          if (avail == 0) return;  // Premature end of input
          ip_limit_ = ip + avail;
        }
        if (!writer->Append(ip, literal_length)) {
          return;
        }
        ip += literal_length;
        MAYBE_REFILL();
      } else {
        const uint32 entry = char_table[c];
        const uint32 trailer = LittleEndian::Load32(ip) & wordmask[entry >> 11];
        const uint32 length = entry & 0xff;
        ip += entry >> 11;

        // copy_offset/256 is encoded in bits 8..10.  By just fetching
        // those bits, we get copy_offset (since the bit-field starts at
        // bit 8).
        const uint32 copy_offset = entry & 0x700;
        if (!writer->AppendFromSelf(copy_offset + trailer, length)) {
          return;
        }
        MAYBE_REFILL();
      }
    }

#undef MAYBE_REFILL
  }